

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O1

void __thiscall
QAbstractProxyModelPrivate::_q_sourceModelColumnsRemoved
          (QAbstractProxyModelPrivate *this,QModelIndex *parent,int param_2,int param_3)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((parent->r < 0) || (parent->c < 0)) || ((parent->m).ptr == (QAbstractItemModel *)0x0)) {
    QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
    ::value(&this->model);
    iVar2 = (*(((this->model).super_QPropertyData<QAbstractItemModel_*>.val)->super_QObject).
              _vptr_QObject[0x10])();
    if (iVar2 == 0) {
      scheduleHeaderUpdate(this,Vertical);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractProxyModelPrivate::_q_sourceModelColumnsRemoved(const QModelIndex &parent, int, int)
{
    if (parent.isValid())
        return;
    if (model->columnCount() == 0)
        scheduleHeaderUpdate(Qt::Vertical);
}